

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O2

mz_bool mz_zip_writer_init_heap_v2
                  (mz_zip_archive *pZip,size_t size_to_reserve_at_beginning,
                  size_t initial_allocation_size,mz_uint flags)

{
  mz_zip_internal_state *pmVar1;
  mz_bool mVar2;
  void *pvVar3;
  
  pZip->m_pWrite = mz_zip_heap_write_func;
  pZip->m_pNeeds_keepalive = (mz_file_needs_keepalive)0x0;
  if ((short)flags < 0) {
    pZip->m_pRead = mz_zip_mem_read_func;
  }
  pZip->m_pIO_opaque = pZip;
  mVar2 = mz_zip_writer_init_v2(pZip,size_to_reserve_at_beginning,flags);
  if (mVar2 == 0) {
    mVar2 = 0;
  }
  else {
    if (size_to_reserve_at_beginning < initial_allocation_size) {
      size_to_reserve_at_beginning = initial_allocation_size;
    }
    pZip->m_zip_type = MZ_ZIP_TYPE_HEAP;
    mVar2 = 1;
    if (size_to_reserve_at_beginning != 0) {
      pvVar3 = (*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,size_to_reserve_at_beginning);
      pmVar1 = pZip->m_pState;
      pmVar1->m_pMem = pvVar3;
      if (pvVar3 == (void *)0x0) {
        mVar2 = 0;
        mz_zip_writer_end_internal(pZip,0);
        pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
      }
      else {
        pmVar1->m_mem_capacity = size_to_reserve_at_beginning;
      }
    }
  }
  return mVar2;
}

Assistant:

mz_bool mz_zip_writer_init_heap_v2(mz_zip_archive *pZip, size_t size_to_reserve_at_beginning, size_t initial_allocation_size, mz_uint flags)
{
    pZip->m_pWrite = mz_zip_heap_write_func;
    pZip->m_pNeeds_keepalive = NULL;

    if (flags & MZ_ZIP_FLAG_WRITE_ALLOW_READING)
        pZip->m_pRead = mz_zip_mem_read_func;

    pZip->m_pIO_opaque = pZip;

    if (!mz_zip_writer_init_v2(pZip, size_to_reserve_at_beginning, flags))
        return MZ_FALSE;

    pZip->m_zip_type = MZ_ZIP_TYPE_HEAP;

    if (0 != (initial_allocation_size = MZ_MAX(initial_allocation_size, size_to_reserve_at_beginning)))
    {
        if (NULL == (pZip->m_pState->m_pMem = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, initial_allocation_size)))
        {
            mz_zip_writer_end_internal(pZip, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }
        pZip->m_pState->m_mem_capacity = initial_allocation_size;
    }

    return MZ_TRUE;
}